

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int AllocateAndInitRescaler(VP8LDecoder *dec,VP8Io *io)

{
  int iVar1;
  WebPRescaler *pWVar2;
  WebPRescaler *in_RSI;
  VP8LDecoder *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  rescaler_t *in_stack_00000010;
  uint8_t *memory;
  uint64_t memory_size;
  uint32_t *scaled_data;
  uint64_t scaled_data_size;
  rescaler_t *work;
  uint64_t work_size;
  int out_height;
  int in_height;
  int out_width;
  int in_width;
  int num_channels;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint64_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffd0;
  int dst_width;
  uint32_t uVar3;
  uint32_t src_height;
  int src_width;
  int local_4;
  
  src_width = 4;
  src_height = in_RSI->fx_scale;
  iVar1 = in_RSI[1].x_add;
  uVar3 = in_RSI->fy_scale;
  dst_width = in_RSI[1].x_sub;
  pWVar2 = (WebPRescaler *)
           WebPSafeMalloc(in_stack_ffffffffffffff98,
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (pWVar2 == (WebPRescaler *)0x0) {
    local_4 = VP8LSetError(in_RDI,VP8_STATUS_OUT_OF_MEMORY);
  }
  else {
    in_RDI->rescaler_memory = (uint8_t *)pWVar2;
    in_RDI->rescaler = pWVar2;
    iVar1 = WebPRescalerInit(in_RSI,src_width,src_height,(uint8_t *)CONCAT44(iVar1,uVar3),dst_width,
                             in_stack_ffffffffffffffd0,unaff_retaddr,in_stack_00000008,
                             in_stack_00000010);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int AllocateAndInitRescaler(VP8LDecoder* const dec, VP8Io* const io) {
  const int num_channels = 4;
  const int in_width = io->mb_w;
  const int out_width = io->scaled_width;
  const int in_height = io->mb_h;
  const int out_height = io->scaled_height;
  const uint64_t work_size = 2 * num_channels * (uint64_t)out_width;
  rescaler_t* work;        // Rescaler work area.
  const uint64_t scaled_data_size = (uint64_t)out_width;
  uint32_t* scaled_data;  // Temporary storage for scaled BGRA data.
  const uint64_t memory_size = sizeof(*dec->rescaler) +
                               work_size * sizeof(*work) +
                               scaled_data_size * sizeof(*scaled_data);
  uint8_t* memory = (uint8_t*)WebPSafeMalloc(memory_size, sizeof(*memory));
  if (memory == NULL) {
    return VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
  }
  assert(dec->rescaler_memory == NULL);
  dec->rescaler_memory = memory;

  dec->rescaler = (WebPRescaler*)memory;
  memory += sizeof(*dec->rescaler);
  work = (rescaler_t*)memory;
  memory += work_size * sizeof(*work);
  scaled_data = (uint32_t*)memory;

  if (!WebPRescalerInit(dec->rescaler, in_width, in_height,
                        (uint8_t*)scaled_data, out_width, out_height,
                        0, num_channels, work)) {
    return 0;
  }
  return 1;
}